

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  ushort *puVar1;
  byte bVar2;
  Btree *pBtree;
  MemPage *pPage;
  u8 *pCell;
  BtShared *pBt;
  Pgno parent;
  char cVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  u8 *puVar10;
  undefined8 uVar11;
  uint uVar12;
  ulong uVar13;
  void *pvVar14;
  uint uVar15;
  u64 v;
  u8 *puVar16;
  uchar *pCell_00;
  long in_FS_OFFSET;
  bool bVar17;
  UnpackedRecord r;
  int loc;
  int rc;
  uint local_c0;
  KeyInfo *local_b8;
  int local_a8;
  uint local_8c;
  uint *local_88;
  BtreePayload local_78;
  int local_48;
  uint local_44;
  Pgno local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_44 = 0xaaaaaaaa;
  pBtree = pCur->pBtree;
  local_48 = seekResult;
  if ((pCur->curFlags & 0x20) == 0) {
LAB_00150fb2:
    if ((pCur->eState < 3) ||
       (uVar5 = moveToRoot(pCur), local_44 = uVar5, (uVar5 & 0xffffffef) == 0)) {
      if (pCur->pKeyInfo == (KeyInfo *)0x0) {
        if (pBtree->hasIncrblobCur != '\0') {
          invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,pX->nKey,0);
        }
        if (((pCur->curFlags & 2) == 0) || (pX->nKey != (pCur->info).nKey)) {
          if (seekResult == 0) {
            uVar5 = sqlite3BtreeTableMoveto(pCur,pX->nKey,(uint)flags >> 3 & 1,&local_48);
            local_44 = uVar5;
            if (uVar5 != 0) goto LAB_00151ca1;
            local_44 = 0;
          }
        }
        else if (((pCur->info).nSize != 0) && ((pCur->info).nPayload == pX->nZero + pX->nData)) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            iVar6 = btreeOverwriteCell(pCur,pX);
            return iVar6;
          }
          goto LAB_00151d22;
        }
      }
      else {
        if ((flags & 2U) == 0 && seekResult == 0) {
          if (pX->nMem == 0) {
            local_44 = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)flags >> 3 & 1,&local_48);
          }
          else {
            local_78.pData = &DAT_aaaaaaaaaaaaaaaa;
            local_78.nKey = (sqlite3_int64)pX->aMem;
            local_78.aMem._0_7_ = (uint7)CONCAT24(pX->nMem,0xaaaaaaaa);
            local_78.aMem = (sqlite3_value *)CONCAT17(0xaa,(uint7)local_78.aMem);
            local_78.nMem = 0xaaaa;
            local_78._34_2_ = 0xaa00;
            local_78.nData = -0x55555556;
            local_78.pKey = pCur->pKeyInfo;
            local_44 = sqlite3BtreeIndexMoveto(pCur,(UnpackedRecord *)&local_78,&local_48);
          }
          uVar5 = local_44;
          if (local_44 != 0) goto LAB_00151ca1;
        }
        if (local_48 == 0) {
          getCellInfo(pCur);
          if ((pCur->info).nKey == pX->nKey) {
            local_78.aMem = (sqlite3_value *)&DAT_aaaaaaaaaaaaaaaa;
            local_78.pKey = &DAT_aaaaaaaaaaaaaaaa;
            local_78.nKey = (sqlite3_int64)&DAT_aaaaaaaaaaaaaaaa;
            local_78.pData = pX->pKey;
            local_78.nData = (int)pX->nKey;
            local_78._32_4_ = 0xaaaaaaaa;
            local_78.nZero = 0;
            local_78._44_4_ = 0xaaaaaaaa;
            uVar5 = btreeOverwriteCell(pCur,&local_78);
            goto LAB_00151ca1;
          }
        }
      }
      pPage = pCur->pPage;
      if (pPage->nFree < 0) {
        if (pCur->eState < 2) {
          uVar5 = btreeComputeFreeSpace(pPage);
        }
        else {
          uVar5 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13985,
                      "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
        }
        local_44 = uVar5;
        if (uVar5 != 0) goto LAB_00151ca1;
        local_44 = 0;
      }
      pCell = pBtree->pBt->pTmpSpace;
      if ((char)(byte)flags < '\0') {
        local_44 = 0;
        uVar5 = pBtree->pBt->nPreformatSize;
        uVar9 = (ulong)uVar5;
        if ((int)uVar5 < 4) {
          pCell[3] = '\0';
          uVar9 = 4;
        }
        if ((pBtree->pBt->autoVacuum != '\0') && ((uint)pPage->maxLocal < (uint)uVar9)) {
          local_78.pData = &DAT_aaaaaaaaaaaaaaaa;
          local_78.pKey = &DAT_aaaaaaaaaaaaaaaa;
          local_78.nKey = (sqlite3_int64)&DAT_aaaaaaaaaaaaaaaa;
          (*pPage->xParseCell)(pPage,pCell,(CellInfo *)&local_78);
          if ((uint)local_78.pData != local_78.pData._4_2_) {
            uVar5 = *(uint *)(pCell + (uVar9 - 4));
            ptrmapPut(pBtree->pBt,
                      uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                      uVar5 << 0x18,'\x03',pPage->pgno,(int *)&local_44);
            if (local_44 != 0) goto LAB_00151c9a;
          }
        }
LAB_0015171f:
        uVar4 = pCur->ix;
        local_b8 = (KeyInfo *)(ulong)uVar4;
        uVar5 = (uint)uVar4;
        (pCur->info).nSize = 0;
        local_c0 = (uint)uVar9;
        if (local_48 == 0) {
          local_78.pData = &DAT_aaaaaaaaaaaaaaaa;
          local_78.pKey = &DAT_aaaaaaaaaaaaaaaa;
          local_78.nKey = (sqlite3_int64)&DAT_aaaaaaaaaaaaaaaa;
          if (uVar4 < pPage->nCell) {
            local_44 = sqlite3PagerWrite(pPage->pDbPage);
            if (local_44 == 0) {
              pCell_00 = pPage->aData +
                         (CONCAT11(pPage->aCellIdx[(long)local_b8 * 2],
                                   pPage->aCellIdx[(long)local_b8 * 2 + 1]) & pPage->maskPage);
              if (pPage->leaf == '\0') {
                *(undefined4 *)pCell = *(undefined4 *)pCell_00;
              }
              (*pPage->xParseCell)(pPage,pCell_00,(CellInfo *)&local_78);
              uVar7 = 0;
              if ((uint)local_78.pData != local_78.pData._4_2_) {
                uVar7 = clearCellOverflow(pPage,pCell_00,(CellInfo *)&local_78);
              }
              pCur->curFlags = pCur->curFlags & 0xfb;
              local_44 = uVar7;
              if (local_c0 == local_78.pData._6_2_) {
                if (((uint)local_78.pData == local_78.pData._4_2_) &&
                   ((pBtree->pBt->autoVacuum == '\0' || ((int)local_c0 < (int)(uint)pPage->minLocal)
                    ))) {
                  if (pCell_00 < pPage->aData + (ulong)pPage->hdrOffset + 10) {
                    uVar5 = 0xb;
                    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x139ca,
                                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
                    cVar3 = '\x01';
                  }
                  else {
                    if (pPage->aDataEnd < pCell_00 + (int)local_c0) {
                      uVar5 = 0xb;
                      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x139cd,
                                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70"
                                 );
                    }
                    else {
                      memcpy(pCell_00,pCell,(long)(int)local_c0);
                      uVar5 = 0;
                    }
                    cVar3 = '\x01';
                  }
                  goto LAB_00151909;
                }
              }
              dropCell(pPage,(uint)uVar4,(uint)local_78.pData._6_2_,(int *)&local_44);
              cVar3 = (local_44 != 0) * '\x02';
            }
            else {
              cVar3 = '\x02';
            }
          }
          else {
            uVar5 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x139af,
                        "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
            cVar3 = '\x01';
          }
LAB_00151909:
          if (cVar3 != '\0') {
            if (cVar3 != '\x02') goto LAB_00151ca1;
            goto LAB_00151c9a;
          }
        }
        else if ((local_48 < 0) && (pPage->nCell != 0)) {
          pCur->ix = uVar4 + 1;
          local_b8 = (KeyInfo *)(ulong)(ushort)(uVar4 + 1);
          pCur->curFlags = pCur->curFlags & 0xf9;
        }
        uVar5 = local_c0 + 2;
        if (pPage->nFree < (int)uVar5) {
          bVar2 = pPage->nOverflow;
          pPage->nOverflow = bVar2 + 1;
          pPage->apOvfl[bVar2] = pCell;
          pPage->aiOvfl[bVar2] = (u16)local_b8;
LAB_00151c02:
          local_44 = 0;
        }
        else {
          uVar7 = sqlite3PagerWrite(pPage->pDbPage);
          if (uVar7 == 0) {
            puVar16 = pPage->aData;
            uVar9 = (ulong)pPage->hdrOffset;
            local_78.pKey = (void *)((ulong)local_78.pKey & 0xffffffff00000000);
            uVar7 = (uint)pPage->cellOffset + (uint)pPage->nCell * 2;
            uVar4 = *(ushort *)(puVar16 + uVar9 + 5) << 8 | *(ushort *)(puVar16 + uVar9 + 5) >> 8;
            uVar15 = (uint)uVar4;
            if (uVar4 < uVar7) {
              if ((uVar15 == 0) && (uVar15 = 0x10000, pPage->pBt->usableSize == 0x10000))
              goto LAB_00151a2d;
              uVar11 = 0x11bb1;
LAB_00151a21:
              local_a8 = 0;
              puVar10 = (u8 *)0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar11,
                          "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
            }
            else {
              if ((int)pPage->pBt->usableSize < (int)uVar15) {
                uVar11 = 0x11bb4;
                goto LAB_00151a21;
              }
LAB_00151a2d:
              if (((puVar16[uVar9 + 2] != '\0') || (local_a8 = 0, puVar16[uVar9 + 1] != '\0')) &&
                 (local_a8 = 0, uVar7 + 2 <= uVar15)) {
                puVar10 = pageFindSlot(pPage,local_c0,(int *)&local_78);
                if (puVar10 == (u8 *)0x0) {
                  puVar10 = (u8 *)((ulong)local_78.pKey & 0xffffffff);
                  bVar17 = (int)local_78.pKey == 0;
                  local_a8 = 0;
                }
                else {
                  local_a8 = (int)puVar16;
                  local_a8 = (int)puVar10 - local_a8;
                  bVar17 = false;
                  if ((int)uVar7 < local_a8) {
                    puVar10 = (u8 *)0x0;
                  }
                  else {
                    puVar10 = (u8 *)0xb;
                    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11bc5,
                                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
                    bVar17 = false;
                  }
                }
                if (!bVar17) goto LAB_00151b23;
              }
              if ((int)uVar15 < (int)(uVar7 + uVar5)) {
                iVar8 = pPage->nFree - uVar5;
                iVar6 = 4;
                if (iVar8 < 4) {
                  iVar6 = iVar8;
                }
                uVar7 = defragmentPage(pPage,iVar6);
                puVar10 = (u8 *)(ulong)uVar7;
                local_78.pKey = (void *)CONCAT44(local_78.pKey._4_4_,uVar7);
                if (uVar7 != 0) goto LAB_00151b23;
                uVar15 = (((uint)puVar16[uVar9 + 5] * 0x100 + (uint)puVar16[uVar9 + 6]) - 1 & 0xffff
                         ) + 1;
              }
              local_a8 = uVar15 - local_c0;
              *(ushort *)(puVar16 + uVar9 + 5) = (ushort)local_a8 << 8 | (ushort)local_a8 >> 8;
              puVar10 = (u8 *)0x0;
            }
LAB_00151b23:
            if ((int)puVar10 == 0) {
              pPage->nFree = pPage->nFree - (uVar5 & 0xffff);
              memcpy(puVar16 + local_a8,pCell,(long)(int)local_c0);
              puVar1 = (ushort *)(pPage->aCellIdx + (long)local_b8 * 2);
              memmove(puVar1 + 1,pPage->aCellIdx + (long)local_b8 * 2,
                      ((ulong)pPage->nCell - (long)local_b8) * 2);
              *puVar1 = (ushort)local_a8 << 8 | (ushort)local_a8 >> 8;
              pPage->nCell = pPage->nCell + 1;
              puVar10 = puVar16 + (ulong)pPage->hdrOffset + 4;
              *puVar10 = *puVar10 + '\x01';
              if (*puVar10 == '\0') {
                puVar16[(ulong)pPage->hdrOffset + 3] = puVar16[(ulong)pPage->hdrOffset + 3] + '\x01'
                ;
              }
              if (pPage->pBt->autoVacuum == '\0') {
                bVar17 = true;
              }
              else {
                local_78.pKey = (void *)((ulong)local_78.pKey & 0xffffffff00000000);
                ptrmapPutOvflPtr(pPage,pPage,pCell,(int *)&local_78);
                puVar16 = (u8 *)((ulong)local_78.pKey & 0xffffffff);
                bVar17 = (int)local_78.pKey == 0;
              }
            }
            else {
              bVar17 = false;
              puVar16 = puVar10;
            }
          }
          else {
            bVar17 = false;
            puVar16 = (u8 *)(ulong)uVar7;
          }
          local_44 = (uint)puVar16;
          if (bVar17) goto LAB_00151c02;
        }
        if (pPage->nOverflow != '\0') {
          pCur->curFlags = pCur->curFlags & 0xf9;
          local_44 = balance(pCur);
          pCur->pPage->nOverflow = '\0';
          pCur->eState = '\x01';
          if ((local_44 == 0 & (byte)flags >> 1) == 1) {
            btreeReleaseAllCursorPages(pCur);
            if (pCur->pKeyInfo != (KeyInfo *)0x0) {
              pvVar14 = sqlite3Malloc(pX->nKey);
              pCur->pKey = pvVar14;
              if (pvVar14 == (void *)0x0) {
                local_44 = 7;
              }
              else {
                memcpy(pvVar14,pX->pKey,pX->nKey);
              }
            }
            pCur->eState = '\x03';
            pCur->nKey = pX->nKey;
          }
        }
      }
      else {
        local_3c = 0xaaaaaaaa;
        local_40 = 0xaaaaaaaa;
        bVar2 = pPage->childPtrSize;
        if (pPage->intKey == '\0') {
          pvVar14 = pX->pKey;
          uVar13 = pX->nKey;
          if ((uint)uVar13 < 0x80) {
            pCell[bVar2] = (u8)uVar13;
            uVar5 = 1;
          }
          else {
            uVar5 = sqlite3PutVarint(pCell + bVar2,(long)(int)(uint)uVar13);
            uVar5 = uVar5 & 0xff;
          }
          iVar6 = uVar5 + bVar2;
          v = uVar13 & 0xffffffff;
        }
        else {
          uVar13 = (ulong)pX->nData;
          v = (long)pX->nZero + uVar13;
          pvVar14 = pX->pData;
          if ((uint)v < 0x80) {
            pCell[bVar2] = (u8)v;
            uVar5 = 1;
          }
          else {
            uVar5 = sqlite3PutVarint(pCell + bVar2,v);
            uVar5 = uVar5 & 0xff;
          }
          iVar6 = sqlite3PutVarint(pCell + (uVar5 + bVar2),pX->nKey);
          iVar6 = iVar6 + uVar5 + bVar2;
        }
        puVar16 = pCell + iVar6;
        iVar8 = (int)v;
        if ((int)(uint)pPage->maxLocal < iVar8) {
          uVar4 = pPage->minLocal;
          pBt = pPage->pBt;
          local_b8 = (KeyInfo *)0x0;
          uVar5 = (iVar8 - (uint)uVar4) % (pBt->usableSize - 4) + (uint)uVar4;
          if ((int)(uint)pPage->maxLocal < (int)uVar5) {
            uVar5 = (uint)uVar4;
          }
          uVar9 = (ulong)(iVar6 + uVar5 + 4);
          local_88 = (uint *)(pCell + (int)(uVar5 + iVar6));
          local_40 = 0;
          do {
            do {
              uVar15 = (uint)v;
              uVar7 = uVar5;
              if ((int)uVar15 < (int)uVar5) {
                uVar7 = uVar15;
              }
              uVar12 = (uint)uVar13;
              if ((int)uVar12 < (int)uVar7) {
                if ((int)uVar12 < 1) {
                  memset(puVar16,0,(long)(int)uVar7);
                }
                else {
                  memcpy(puVar16,pvVar14,uVar13 & 0xffffffff);
                  uVar7 = uVar12;
                }
              }
              else {
                memcpy(puVar16,pvVar14,(long)(int)uVar7);
              }
              parent = local_40;
              v = (u64)(uVar15 - uVar7);
              if (uVar15 - uVar7 == 0 || (int)uVar15 < (int)uVar7) {
                local_8c = 0;
                if (local_b8 != (KeyInfo *)0x0) {
                  sqlite3PagerUnrefNotNull((DbPage *)local_b8[2].aColl[0]);
                }
                goto LAB_00151710;
              }
              puVar16 = puVar16 + (int)uVar7;
              pvVar14 = (void *)((long)pvVar14 + (long)(int)uVar7);
              uVar13 = (ulong)(uVar12 - uVar7);
              uVar5 = uVar5 - uVar7;
            } while (uVar5 != 0);
            local_78.pKey = (KeyInfo *)0x0;
            if (pBt->autoVacuum != '\0') {
              do {
                uVar7 = local_40;
                local_40 = uVar7 + 1;
                uVar5 = 0;
                if (1 < local_40) {
                  iVar6 = (uVar7 - 1) - (uVar7 - 1) % (pBt->usableSize / 5 + 1);
                  uVar5 = iVar6 + (uint)(iVar6 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2
                  ;
                }
              } while ((local_40 == uVar5) || (uVar7 == (uint)sqlite3PendingByte / pBt->pageSize));
              local_40 = uVar7 + 1;
            }
            local_3c = allocateBtreePage(pBt,(MemPage **)&local_78,&local_40,local_40,'\0');
            if (((local_3c == 0 && pBt->autoVacuum != '\0') &&
                (ptrmapPut(pBt,local_40,'\x04' - (parent == 0),parent,(int *)&local_3c),
                local_3c != 0)) && ((KeyInfo *)local_78.pKey != (KeyInfo *)0x0)) {
              sqlite3PagerUnrefNotNull
                        ((DbPage *)((KeyInfo *)((long)local_78.pKey + 0x50))->aColl[0]);
            }
            uVar7 = local_3c;
            if (local_3c == 0) {
              *local_88 = local_40 >> 0x18 | (local_40 & 0xff0000) >> 8 | (local_40 & 0xff00) << 8 |
                          local_40 << 0x18;
              if (local_b8 != (KeyInfo *)0x0) {
                sqlite3PagerUnrefNotNull((DbPage *)local_b8[2].aColl[0]);
              }
              local_88 = *(uint **)((long)local_78.pKey + 0x50);
              *local_88 = 0;
              local_b8 = (KeyInfo *)local_78.pKey;
              puVar16 = (u8 *)(*(long *)((long)local_78.pKey + 0x50) + 4);
              uVar5 = pBt->usableSize - 4;
            }
            else {
              uVar5 = 0;
              if (local_b8 == (KeyInfo *)0x0) {
                local_8c = local_3c;
              }
              else {
                sqlite3PagerUnrefNotNull((DbPage *)local_b8[2].aColl[0]);
                local_8c = uVar7;
              }
            }
          } while (uVar7 == 0);
        }
        else {
          uVar9 = (ulong)(uint)(iVar6 + iVar8);
          if (iVar6 + iVar8 < 4) {
            puVar16[iVar8] = '\0';
            uVar9 = 4;
          }
          iVar6 = (int)uVar13;
          memcpy(puVar16,pvVar14,(long)iVar6);
          local_8c = 0;
          memset(puVar16 + iVar6,0,(long)(iVar8 - iVar6));
        }
LAB_00151710:
        local_44 = local_8c;
        if (local_8c == 0) goto LAB_0015171f;
      }
LAB_00151c9a:
      uVar5 = local_44;
    }
  }
  else {
    uVar5 = saveAllCursors(pBtree->pBt,pCur->pgnoRoot,pCur);
    local_44 = uVar5;
    if (uVar5 == 0) {
      if ((seekResult == 0) || (-1 < pCur->iPage)) goto LAB_00150fb2;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1390a,
                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
      uVar5 = 0xb;
    }
  }
LAB_00151ca1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar5;
  }
LAB_00151d22:
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior IndexMoveto() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND|BTREE_PREFORMAT))==flags );
  assert( (flags & BTREE_PREFORMAT)==0 || seekResult || pCur->pKeyInfo==0 );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the
  ** integer key to use. It then calls this function to actually insert the
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(p->pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
    if( loc && pCur->iPage<0 ){
      /* This can only happen if the schema is corrupt such that there is more
      ** than one table or index with the same root page as used by the cursor.
      ** Which can only happen if the SQLITE_NoSchemaError flag was set when
      ** the schema was loaded. This cannot be asserted though, as a user might
      ** set the flag, load the schema, and then unset the flag.  */
      return SQLITE_CORRUPT_PGNO(pCur->pgnoRoot);
    }
  }

  /* Ensure that the cursor is not in the CURSOR_FAULT state and that it
  ** points to a valid cell.
  */
  if( pCur->eState>=CURSOR_REQUIRESEEK ){
    testcase( pCur->eState==CURSOR_REQUIRESEEK );
    testcase( pCur->eState==CURSOR_FAULT );
    rc = moveToRoot(pCur);
    if( rc && rc!=SQLITE_EMPTY ) return rc;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && p->pBt->inTransaction==TRANS_WRITE
              && (p->pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (flags & BTREE_PREFORMAT) || (pX->pKey==0)==(pCur->pKeyInfo==0) );

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob
    ** cursors open on the row being replaced */
    if( p->hasIncrblobCur ){
      invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);
    }

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
#ifdef SQLITE_DEBUG
    if( flags & BTREE_SAVEPOSITION ){
      assert( pCur->curFlags & BTCF_ValidNKey );
      assert( pX->nKey==pCur->info.nKey );
      assert( loc==0 );
    }
#endif

    /* On the other hand, BTREE_SAVEPOSITION==0 does not imply
    ** that the cursor is not pointing to a row to be overwritten.
    ** So do a complete check.
    */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      /* The cursor is pointing to the entry that is to be
      ** overwritten */
      assert( pX->nData>=0 && pX->nZero>=0 );
      if( pCur->info.nSize!=0
       && pCur->info.nPayload==(u32)pX->nData+pX->nZero
      ){
        /* New entry is the same size as the old.  Do an overwrite */
        return btreeOverwriteCell(pCur, pX);
      }
      assert( loc==0 );
    }else if( loc==0 ){
      /* The cursor is *not* pointing to the cell to be overwritten, nor
      ** to an adjacent cell.  Move the cursor so that it is pointing either
      ** to the cell to be overwritten or an adjacent cell.
      */
      rc = sqlite3BtreeTableMoveto(pCur, pX->nKey,
               (flags & BTREE_APPEND)!=0, &loc);
      if( rc ) return rc;
    }
  }else{
    /* This is an index or a WITHOUT ROWID table */

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
    assert( (flags & BTREE_SAVEPOSITION)==0 || loc==0 );

    /* If the cursor is not already pointing either to the cell to be
    ** overwritten, or if a new cell is being inserted, if the cursor is
    ** not pointing to an immediately adjacent cell, then move the cursor
    ** so that it does.
    */
    if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
      if( pX->nMem ){
        UnpackedRecord r;
        r.pKeyInfo = pCur->pKeyInfo;
        r.aMem = pX->aMem;
        r.nField = pX->nMem;
        r.default_rc = 0;
        r.eqSeen = 0;
        rc = sqlite3BtreeIndexMoveto(pCur, &r, &loc);
      }else{
        rc = btreeMoveto(pCur, pX->pKey, pX->nKey,
                    (flags & BTREE_APPEND)!=0, &loc);
      }
      if( rc ) return rc;
    }

    /* If the cursor is currently pointing to an entry to be overwritten
    ** and the new content is the same as as the old, then use the
    ** overwrite optimization.
    */
    if( loc==0 ){
      getCellInfo(pCur);
      if( pCur->info.nKey==pX->nKey ){
        BtreePayload x2;
        x2.pData = pX->pKey;
        x2.nData = pX->nKey;
        x2.nZero = 0;
        return btreeOverwriteCell(pCur, &x2);
      }
    }
  }
  assert( pCur->eState==CURSOR_VALID
       || (pCur->eState==CURSOR_INVALID && loc) || CORRUPT_DB );

  pPage = pCur->pPage;
  assert( pPage->intKey || pX->nKey>=0 || (flags & BTREE_PREFORMAT) );
  assert( pPage->leaf || !pPage->intKey );
  if( pPage->nFree<0 ){
    if( NEVER(pCur->eState>CURSOR_INVALID) ){
     /* ^^^^^--- due to the moveToRoot() call above */
      rc = SQLITE_CORRUPT_PAGE(pPage);
    }else{
      rc = btreeComputeFreeSpace(pPage);
    }
    if( rc ) return rc;
  }

  TRACE(("INSERT: table=%u nkey=%lld ndata=%u page=%u %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit || CORRUPT_DB );
  newCell = p->pBt->pTmpSpace;
  assert( newCell!=0 );
  assert( BTREE_PREFORMAT==OPFLAG_PREFORMAT );
  if( flags & BTREE_PREFORMAT ){
    rc = SQLITE_OK;
    szNew = p->pBt->nPreformatSize;
    if( szNew<4 ){
      szNew = 4;
      newCell[3] = 0;
    }
    if( ISAUTOVACUUM(p->pBt) && szNew>pPage->maxLocal ){
      CellInfo info;
      pPage->xParseCell(pPage, newCell, &info);
      if( info.nPayload!=info.nLocal ){
        Pgno ovfl = get4byte(&newCell[szNew-4]);
        ptrmapPut(p->pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, &rc);
        if( NEVER(rc) ) goto end_insert;
      }
    }
  }else{
    rc = fillInCell(pPage, newCell, pX, &szNew);
    if( rc ) goto end_insert;
  }
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(p->pBt) );
  idx = pCur->ix;
  pCur->info.nSize = 0;
  if( loc==0 ){
    CellInfo info;
    assert( idx>=0 );
    if( idx>=pPage->nCell ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    BTREE_CLEAR_CELL(rc, pPage, oldCell, info);
    testcase( pCur->curFlags & BTCF_ValidOvfl );
    invalidateOverflowCache(pCur);
    if( info.nSize==szNew && info.nLocal==info.nPayload
     && (!ISAUTOVACUUM(p->pBt) || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell().
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell < pPage->aData+pPage->hdrOffset+10 ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      if( oldCell+szNew > pPage->aDataEnd ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  }else{
    assert( pPage->leaf );
  }
  rc = insertCellFast(pPage, idx, newCell, szNew);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance()
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise.
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->pPage->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      btreeReleaseAllCursorPages(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->iPage<0 || pCur->pPage->nOverflow==0 );

end_insert:
  return rc;
}